

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O1

void __thiscall
FIX::SocketAcceptor::onInitialize(SocketAcceptor *this,SessionSettings *sessionSettings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_node_base *p_Var2;
  SessionID *__v;
  bool bVar3;
  bool reuse;
  short sVar4;
  mapped_type_conflict1 mVar5;
  uint uVar6;
  int sendBufSize;
  int rcvBufSize;
  socket_handle socket;
  SocketServer *this_00;
  Dictionary *this_01;
  undefined7 extraout_var;
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  *this_02;
  mapped_type_conflict1 *pmVar7;
  _Base_ptr p_Var8;
  string local_1b8;
  SocketAcceptor *local_198;
  undefined4 local_18c;
  SessionSettings *local_188;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  SessionToPort *local_100;
  PortToSessions *local_f8;
  _Rb_tree_node_base *local_f0;
  SessionID *local_e8;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_60;
  
  local_198 = this;
  local_188 = sessionSettings;
  this_00 = (SocketServer *)operator_new(0x160);
  SocketServer::SocketServer(this_00,1);
  local_198->m_pServer = this_00;
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &local_60,local_188);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    paVar1 = &local_1b8.field_2;
    local_f8 = &local_198->m_portToSessions;
    local_100 = &local_198->m_sessionToPort;
    p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_e8 = (SessionID *)(p_Var8 + 1);
      this_01 = SessionSettings::get(local_188,local_e8);
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"SocketAcceptPort","");
      uVar6 = Dictionary::getInt(this_01,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"SocketReuseAddress","");
      bVar3 = Dictionary::has(this_01,&local_1b8);
      reuse = true;
      if (bVar3) {
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_120,"SocketReuseAddress","");
        reuse = Dictionary::getBool(this_01,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"SocketNodelay","");
      bVar3 = Dictionary::has(this_01,&local_1b8);
      if (bVar3) {
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"SocketNodelay","");
        bVar3 = Dictionary::getBool(this_01,&local_140);
        local_18c = (undefined4)CONCAT71(extraout_var,bVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_18c = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"SocketSendBufferSize","");
      local_f0 = p_Var8;
      bVar3 = Dictionary::has(this_01,&local_1b8);
      sendBufSize = 0;
      if (bVar3) {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"SocketSendBufferSize","");
        sendBufSize = Dictionary::getInt(this_01,&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"SocketReceiveBufferSize","");
      bVar3 = Dictionary::has(this_01,&local_1b8);
      rcvBufSize = 0;
      if (bVar3) {
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,"SocketReceiveBufferSize","");
        rcvBufSize = Dictionary::getInt(this_01,&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      socket = SocketServer::add(local_198->m_pServer,uVar6 & 0xffff,reuse,local_18c._0_1_,
                                 sendBufSize,rcvBufSize);
      __v = local_e8;
      p_Var2 = local_f0;
      sVar4 = socket_hostport(socket);
      local_1b8._M_dataplus._M_p._0_2_ = sVar4;
      this_02 = (_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
                 *)std::
                   map<unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
                   ::operator[](local_f8,(key_type_conflict1 *)&local_1b8);
      std::
      _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
      ::_M_insert_unique<FIX::SessionID_const&>(this_02,__v);
      mVar5 = socket_hostport(socket);
      pmVar7 = std::
               map<FIX::SessionID,_unsigned_short,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_unsigned_short>_>_>
               ::operator[](local_100,__v);
      *pmVar7 = mVar5;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

EXCEPT(RuntimeError) {
  uint16_t port = 0;

  try {
    m_pServer = new SocketServer(1);

    for (const SessionID &sessionID : sessionSettings.getSessions()) {
      const Dictionary &settings = sessionSettings.get(sessionID);
      port = (short)settings.getInt(SOCKET_ACCEPT_PORT);

      const bool reuseAddress = settings.has(SOCKET_REUSE_ADDRESS) ? settings.getBool(SOCKET_REUSE_ADDRESS) : true;

      const bool noDelay = settings.has(SOCKET_NODELAY) ? settings.getBool(SOCKET_NODELAY) : false;

      const int sendBufSize = settings.has(SOCKET_SEND_BUFFER_SIZE) ? settings.getInt(SOCKET_SEND_BUFFER_SIZE) : 0;

      const int rcvBufSize = settings.has(SOCKET_RECEIVE_BUFFER_SIZE) ? settings.getInt(SOCKET_RECEIVE_BUFFER_SIZE) : 0;

      socket_handle acceptSocket = m_pServer->add(port, reuseAddress, noDelay, sendBufSize, rcvBufSize);
      m_portToSessions[socket_hostport(acceptSocket)].insert(sessionID);
      m_sessionToPort[sessionID] = socket_hostport(acceptSocket);
    }
  } catch (SocketException &e) {
    delete m_pServer;
    m_pServer = 0;
    throw RuntimeError(
        "Unable to create, bind, or listen to port " + IntConvertor::convert((unsigned short)port) + " (" + e.what()
        + ")");
  }
}